

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollup.c
# Opt level: O3

int main(int argc,char **argv)

{
  vtt_block_t *pvVar1;
  int iVar2;
  int iVar3;
  FILE *flv;
  FILE *flv_00;
  srt_t *srt;
  uint uVar4;
  char *data;
  char **ppcVar5;
  int has_video;
  int has_audio;
  flvtag_t tag;
  int local_48;
  int local_44;
  flvtag_t local_40;
  
  flv = flv_open_read(argv[1]);
  flv_00 = flv_open_write(argv[2]);
  flvtag_init(&local_40);
  srt = srt_new();
  if (*wonderland[0] != '\0') {
    ppcVar5 = wonderland;
    data = wonderland[0];
    do {
      ppcVar5 = ppcVar5 + 1;
      append_caption(data,srt);
      data = *ppcVar5;
    } while (*data != '\0');
  }
  iVar2 = flv_read_header(flv,&local_44,&local_48);
  if (iVar2 == 0) {
    main_cold_1();
    iVar2 = 1;
  }
  else {
    flv_write_header(flv_00,local_44,local_48);
    iVar3 = flv_read_tag(flv,&local_40);
    iVar2 = 0;
    if (iVar3 != 0) {
      do {
        pvVar1 = srt->cue_head;
        if ((((pvVar1 != (vtt_block_t *)0x0) && ((*local_40.data & 0x1f) == 9)) &&
            ((local_40.data[0xb] & 0xf) == 7)) &&
           ((local_40.data[0xc] == 1 &&
            (uVar4 = (uint)local_40.data[5] << 8 |
                     (uint)local_40.data[7] << 0x18 | (uint)local_40.data[4] << 0x10 |
                     (uint)local_40.data[6],
            pvVar1->timestamp <=
            (double)(((uint)local_40.data[0xf] |
                     (uint)local_40.data[0xd] << 0x10 | (uint)local_40.data[0xe] << 8) + uVar4) /
            1000.0)))) {
          fprintf(_stderr,"%f %s\n",
                  (double)(((uint)local_40.data[0xf] |
                           (uint)local_40.data[0xd] << 0x10 | (uint)local_40.data[0xe] << 8) + uVar4
                          ) / 1000.0,pvVar1 + 1);
          flvtag_addcaption_text(&local_40,(utf8_char_t *)(srt->cue_head + 1));
          vtt_cue_free_head(srt);
        }
        flv_write_tag(flv_00,&local_40);
        iVar3 = flv_read_tag(flv,&local_40);
        iVar2 = 0;
      } while (iVar3 != 0);
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    int i = 0;
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    flvtag_init(&tag);

    srt = srt_new();

    for (i = 0; wonderland[i][0]; ++i) {
        append_caption(wonderland[i], srt);
    }

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {
        if (srt->cue_head && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && srt->cue_head->timestamp <= flvtag_pts_seconds(&tag)) {
            fprintf(stderr, "%f %s\n", flvtag_pts_seconds(&tag), srt_cue_data(srt->cue_head));
            flvtag_addcaption_text(&tag, srt_cue_data(srt->cue_head));
            srt_cue_free_head(srt);
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}